

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

SpecialProperties Catch::anon_unknown_2::parseSpecialTag(string *tag)

{
  bool bVar1;
  string *tag_local;
  
  bVar1 = startsWith(tag,'.');
  if ((bVar1) || (bVar1 = std::operator==(tag,"!hide"), bVar1)) {
    return IsHidden;
  }
  bVar1 = std::operator==(tag,"!throws");
  if (bVar1) {
    return Throws;
  }
  bVar1 = std::operator==(tag,"!shouldfail");
  if (!bVar1) {
    bVar1 = std::operator==(tag,"!mayfail");
    if (bVar1) {
      return MayFail;
    }
    bVar1 = std::operator==(tag,"!nonportable");
    if (!bVar1) {
      bVar1 = std::operator==(tag,"!benchmark");
      if (!bVar1) {
        return None;
      }
      return Benchmark|IsHidden;
    }
    return NonPortable;
  }
  return ShouldFail;
}

Assistant:

TestCaseInfo::SpecialProperties parseSpecialTag( std::string const& tag ) {
            if( startsWith( tag, '.' ) ||
                tag == "!hide" )
                return TestCaseInfo::IsHidden;
            else if( tag == "!throws" )
                return TestCaseInfo::Throws;
            else if( tag == "!shouldfail" )
                return TestCaseInfo::ShouldFail;
            else if( tag == "!mayfail" )
                return TestCaseInfo::MayFail;
            else if( tag == "!nonportable" )
                return TestCaseInfo::NonPortable;
            else if( tag == "!benchmark" )
                return static_cast<TestCaseInfo::SpecialProperties>( TestCaseInfo::Benchmark | TestCaseInfo::IsHidden );
            else
                return TestCaseInfo::None;
        }